

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Array<double,_16> * __thiscall
tcu::Matrix<double,_4,_4>::getColumnMajorData
          (Array<double,_16> *__return_storage_ptr__,Matrix<double,_4,_4> *this)

{
  Array<double,_16> *pAVar1;
  int col;
  long lVar2;
  Array<double,_16> *a;
  long lVar3;
  
  pAVar1 = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      *(undefined8 *)((long)__return_storage_ptr__ + lVar3) =
           *(undefined8 *)
            ((long)((Vector<tcu::Vector<double,_4>,_4> *)((Vector<double,_4> *)this)->m_data)->
                   m_data[0].m_data + lVar3);
    }
    this = (Matrix<double,_4,_4> *)((long)this + 0x20);
    __return_storage_ptr__ = (Array<double,_16> *)((long)__return_storage_ptr__ + 0x20);
  }
  return pAVar1;
}

Assistant:

Array<T, Rows*Cols> Matrix<T, Rows, Cols>::getColumnMajorData (void) const
{
	Array<T, Rows*Cols> a;
	T* dst = a.getPtr();
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			*dst++ = (*this)(row, col);
	return a;
}